

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

void __thiscall
HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::And
          (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *this,
          HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *this2)

{
  int iVar1;
  code *pcVar2;
  NodeBase *pNVar3;
  bool bVar4;
  bool bVar5;
  undefined4 *puVar6;
  Type_conflict pSVar7;
  Type *this_00;
  Type *pTVar8;
  Bucket<AddPropertyCacheBucket> *bucket;
  EditingIterator iter;
  Iterator iter2;
  uint i;
  HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *this2_local;
  HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *this_local;
  
  iter2.current._4_4_ = 0;
  do {
    if (this->tableSize <= iter2.current._4_4_) {
      return;
    }
    SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::Iterator
              ((Iterator *)&iter.last,this2->table + iter2.current._4_4_);
    if (iter2.list ==
        (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pNVar3 = iter.last;
    pSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar4 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>
                        *)pNVar3,pSVar7);
    if (bVar4) {
      iter2.list = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)
                   0x0;
    }
    else {
      iter2.list = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)
                   SListNodeBase<Memory::ArenaAllocator>::Next
                             (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    }
    SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
              ((EditingIterator *)&bucket,this->table + iter2.current._4_4_);
    while (bVar4 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                   EditingIterator::Next((EditingIterator *)&bucket), bVar4) {
      this_00 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                Iterator::Data((Iterator *)&bucket);
      while( true ) {
        bVar5 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                Iterator::IsValid((Iterator *)&iter.last);
        bVar4 = false;
        if (bVar5) {
          iVar1 = this_00->value;
          pTVar8 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)&iter.last);
          bVar4 = iVar1 < pTVar8->value;
        }
        if (!bVar4) break;
        if (iter2.list ==
            (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        pNVar3 = iter.last;
        pSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                           (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar4 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>
                            *)pNVar3,pSVar7);
        if (bVar4) {
          iter2.list = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>
                        *)0x0;
        }
        else {
          iter2.list = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>
                        *)SListNodeBase<Memory::ArenaAllocator>::Next
                                    (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
      }
      bVar4 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator
              ::IsValid((Iterator *)&iter.last);
      if ((bVar4) &&
         (iVar1 = this_00->value,
         pTVar8 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                  Iterator::Data((Iterator *)&iter.last), iVar1 == pTVar8->value)) {
        pTVar8 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                 Iterator::Data((Iterator *)&iter.last);
        bVar4 = AddPropertyCacheBucket::operator!=(&this_00->element,&pTVar8->element);
        if (bVar4) goto LAB_004ea622;
        iVar1 = this_00->value;
        pTVar8 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                 Iterator::Data((Iterator *)&iter.last);
        if (iVar1 == pTVar8->value) {
          pTVar8 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)&iter.last);
          bVar4 = AddPropertyCacheBucket::operator==(&this_00->element,&pTVar8->element);
          if (!bVar4) goto LAB_004ea69e;
        }
        else {
LAB_004ea69e:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/HashTable.h"
                             ,0x108,
                             "(bucket.value == iter2.Data().value && bucket.element == iter2.Data().element)"
                             ,"Huh??");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        if (iter2.list ==
            (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        pNVar3 = iter.last;
        pSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                           (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar4 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>
                            *)pNVar3,pSVar7);
        if (bVar4) {
          iter2.list = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>
                        *)0x0;
        }
        else {
          iter2.list = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>
                        *)SListNodeBase<Memory::ArenaAllocator>::Next
                                    (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
      }
      else {
LAB_004ea622:
        SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
        EditingIterator::RemoveCurrent((EditingIterator *)&bucket,this->alloc);
        if (this->stats != (DictionaryStats *)0x0) {
          DictionaryStats::Remove(this->stats,false);
        }
      }
    }
    iter2.current._4_4_ = iter2.current._4_4_ + 1;
  } while( true );
}

Assistant:

void And(HashTable<T> *this2)
    {
        for (uint i = 0; i < this->tableSize; i++)
        {
            _TYPENAME SListBase<Bucket<T>>::Iterator iter2(&this2->table[i]);
            iter2.Next();
            FOREACH_SLISTBASE_ENTRY_EDITING(Bucket<T>, bucket, &this->table[i], iter)
            {
                while (iter2.IsValid() && bucket.value < iter2.Data().value)
                {
                    iter2.Next();
                }

                if (!iter2.IsValid() || bucket.value != iter2.Data().value || bucket.element != iter2.Data().element)
                {
                    iter.RemoveCurrent(this->alloc);
#if PROFILE_DICTIONARY
                    if (stats)
                        stats->Remove(false);
#endif
                    continue;
                }
                else
                {
                    AssertMsg(bucket.value == iter2.Data().value && bucket.element == iter2.Data().element, "Huh??");
                }
                iter2.Next();
            } NEXT_SLISTBASE_ENTRY_EDITING;
        }
    }